

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Buffers::DataTest::LogError
          (DataTest *this,offset_in_DataTest_to_subr UploadDataFunction,GLenum parameter)

{
  ostringstream *this_00;
  int in_ECX;
  undefined4 in_register_00000014;
  long lVar1;
  string the_log;
  stringstream bitfield_string_stream;
  string asStack_208 [32];
  Bitfield<16UL> local_1e8;
  Bitfield<16UL> local_1c0;
  undefined1 local_1a8 [16];
  ostream local_198;
  
  lVar1 = CONCAT44(in_register_00000014,parameter);
  std::__cxx11::string::string<std::allocator<char>>
            (asStack_208,"Unexpected error occurred during the test of ",
             (allocator<char> *)local_1a8);
  if ((((code *)UploadDataFunction == UploadUsingNamedBufferData && lVar1 == 0) ||
      ((code *)UploadDataFunction == UploadUsingNamedBufferSubData && lVar1 == 0)) ||
     ((code *)UploadDataFunction != UploadUsingNamedBufferStorage || lVar1 != 0)) {
    std::__cxx11::string::append((char *)asStack_208);
    std::__cxx11::string::append((char *)asStack_208);
    glu::getUsageName(in_ECX);
    std::__cxx11::string::append((char *)asStack_208);
  }
  else {
    std::__cxx11::string::append((char *)asStack_208);
    std::__cxx11::string::append((char *)asStack_208);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
    glu::getBufferMapFlagsStr(&local_1c0,in_ECX);
    local_1e8.m_end = local_1c0.m_end;
    local_1e8.m_value = local_1c0.m_value;
    local_1e8.m_begin = local_1c0.m_begin;
    tcu::Format::Bitfield<16UL>::toStream(&local_1e8,&local_198);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append(asStack_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  }
  std::__cxx11::string::append((char *)asStack_208);
  local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,asStack_208);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::string::~string(asStack_208);
  return;
}

Assistant:

void DataTest::LogError(void (DataTest::*UploadDataFunction)(glw::GLuint, glw::GLenum), glw::GLenum parameter)
{
	std::string the_log = "Unexpected error occurred during the test of ";

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferData)
	{
		the_log.append("glNamedBufferData");
	}
	else
	{
		if (UploadDataFunction == &DataTest::UploadUsingNamedBufferSubData)
		{
			the_log.append("glNamedBufferSubData");
		}
		else
		{
			if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
			{
				the_log.append("glNamedBufferStorage");
			}
			else
			{
				if (UploadDataFunction == &DataTest::UploadUsingCopyNamedBufferSubData)
				{
					the_log.append("glCopyNamedBufferSubData");
				}
				else
				{
					the_log.append("uknown upload function");
				}
			}
		}
	}

	if (UploadDataFunction == &DataTest::UploadUsingNamedBufferStorage)
	{
		the_log.append(" called with usage parameter ");

		std::stringstream bitfield_string_stream;
		bitfield_string_stream << glu::getBufferMapFlagsStr(parameter);
		the_log.append(bitfield_string_stream.str());
	}
	else
	{
		the_log.append(" called with usage parameter ");
		the_log.append(glu::getUsageName(parameter));
	}
	the_log.append(".");

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}